

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  bool bVar4;
  char cVar6;
  ostream *poVar5;
  int i;
  pointer pvVar7;
  int j;
  long lVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  allocator_type local_299;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  A;
  vector<double,_std::allocator<double>_> t;
  vector<double,_std::allocator<double>_> x_aux;
  vector<double,_std::allocator<double>_> c;
  ofstream file;
  
  A.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  A.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  A.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _file = 0;
  std::vector<double,_std::allocator<double>_>::vector
            (&c,0x18,(value_type *)&file,(allocator_type *)&t);
  _file = 0x4069000000000000;
  std::vector<double,_std::allocator<double>_>::vector
            (&t,0x18,(value_type *)&file,(allocator_type *)&x_aux);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&A,0x18);
  for (lVar11 = 0; lVar11 != 0x240; lVar11 = lVar11 + 0x18) {
    _file = 0;
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               ((long)&((A.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar11),0x18,(value_type *)&file);
  }
  pvVar7 = A.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (lVar11 = 0; cVar6 = (char)(((ushort)lVar11 & 0xff) % 6), lVar11 != 0x18; lVar11 = lVar11 + 1)
  {
    if (((cVar6 != '\0') && (cVar6 != '\x05')) &&
       ((0x17 < (uint)lVar11 || ((0xfc003fU >> ((uint)lVar11 & 0x1f) & 1) == 0)))) {
      pdVar2 = (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2[lVar11 + -1] = 0.25;
      pdVar2[lVar11 + 1] = 0.25;
      pdVar2[lVar11 + -6] = 0.25;
      pdVar2[lVar11 + 6] = 0.25;
    }
    pvVar7 = pvVar7 + 1;
  }
  pdVar2 = A.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0xb].
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2[5] = 0.24141630919814847;
  pdVar2[0x11] = 0.24141630919814847;
  pdVar2[10] = 0.48283261839629693;
  c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  [0xb] = 0.8583690801851501;
  pdVar3 = A.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0x11].
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3[0xb] = pdVar2[5];
  pdVar3[0x17] = pdVar2[0x11];
  pdVar3[0x10] = pdVar2[10];
  c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  [0x11] = c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[0xb];
  pdVar2 = A.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[6].
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  *pdVar2 = 0.25;
  pdVar2[0xc] = 0.25;
  pdVar2[7] = 0.5;
  pdVar2 = A.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0xc].
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2[6] = 0.25;
  pdVar2[0x12] = 0.25;
  pdVar2[0xd] = 0.5;
  *c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       200.0;
  c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start[1]
       = 200.0;
  c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start[2]
       = 200.0;
  c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start[3]
       = 200.0;
  c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start[4]
       = 200.0;
  c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start[5]
       = 200.0;
  pvVar7 = A.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 0x13;
  for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
    pdVar2 = (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2[lVar11 + 0xd] = 0.5;
    pdVar2[lVar11 + 0x12] = 0.25;
    pdVar2[lVar11 + 0x14] = 0.25;
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [lVar11 + 0x13] = 1.3333333035310109;
    pvVar7 = pvVar7 + 1;
  }
  pdVar2 = A.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0x12].
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2[0xc] = 0.5;
  pdVar2[0x13] = 0.5;
  c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  [0x12] = 1.3333333035310109;
  pdVar2 = A.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[0x17].
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2[0x16] = 0.48283261839629693;
  pdVar2[0x11] = 0.48283261839629693;
  c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  [0x17] = 2.1459227004628754;
  _file = 0;
  std::vector<double,_std::allocator<double>_>::vector(&x_aux,0x18,(value_type *)&file,&local_299);
  lVar11 = 0;
  dVar12 = 0.0;
  do {
    for (; lVar11 != 0x18; lVar11 = lVar11 + 1) {
      x_aux.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar11] =
           t.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar11];
      t.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [lVar11] = 0.0;
      pdVar2 = A.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar11].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      dVar13 = 0.0;
      for (lVar8 = 0; lVar8 != 0x18; lVar8 = lVar8 + 1) {
        dVar13 = dVar13 + pdVar2[lVar8] *
                          x_aux.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar8];
        t.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar11] = dVar13;
      }
      dVar1 = c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      t.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [lVar11] = dVar13 + dVar1;
      dVar13 = ABS(x_aux.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11] - (dVar13 + dVar1));
      if (dVar13 <= dVar12) {
        dVar13 = dVar12;
      }
      dVar12 = dVar13;
    }
    lVar11 = 0;
    bVar4 = 0.0001 < dVar12;
    dVar12 = 0.0;
  } while (bVar4);
  std::ofstream::ofstream(&file);
  std::ofstream::open((char *)&file,0x102038);
  std::operator<<((ostream *)&file,"# X Y Z\n");
  iVar10 = 0;
  for (uVar9 = 0; uVar9 != 0x18; uVar9 = uVar9 + 1) {
    poVar5 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&file,iVar10 + (int)((uVar9 & 0xffffffff) / 6) * -0x1e0);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = (ostream *)
             std::ostream::operator<<(poVar5,(uint)(byte)(((ushort)uVar9 & 0xff) / 6) * 0x50);
    std::operator<<(poVar5," ");
    poVar5 = std::ostream::_M_insert<double>
                       (t.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar9]);
    std::operator<<(poVar5,"\n");
    iVar10 = iVar10 + 0x50;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&file);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&x_aux.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&t.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&c.super__Vector_base<double,_std::allocator<double>_>);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&A);
  return 0;
}

Assistant:

int main(){
  double dx = 0.08f, dy = 0.08f;
  double h = 40.0f, t_f = 25.0f, lambda = 45.0f, q_w = 1500;

  std::vector<std::vector<double> > A;
  std::vector<double> c(24,0);
  std::vector<double> t(24,200);
  A.resize(24);
  for (int i=0;i<24;i++){
    A[i].resize(24,0);
  }

  // Inner points
  for (int i=0;i<24;i++){
    if ((i%6 == 0) || (i%6 == 5)) continue;
    if ((i/6 == 0) || (i/6 == 3)) continue;
    A[i][i-1] = 0.25f;
    A[i][i+1] = 0.25f;
    A[i][i-6] = 0.25f;
    A[i][i+6] = 0.25f;
  }

  // Convection
  double two_h_x_l = 2.0f * h * dx / lambda;
  A[11][5] = 1.0f / (4.0f + two_h_x_l);
  A[11][17] = A[11][5];
  A[11][10] = 2 * A[11][5];
  c[11] = two_h_x_l / (4.0f + two_h_x_l) * t_f;
  A[17][11] = A[11][5];
  A[17][23] = A[11][17];
  A[17][16] = A[11][10];
  c[17] = c[11];

  // Insulation
  A[6][0] = 0.25f;
  A[6][12] = 0.25f;
  A[6][7] = 0.5f;
  A[12][6] = 0.25f;
  A[12][18] = 0.25f;
  A[12][13] = 0.5f;

  // I
  c[0] = 200.0f;
  c[1] = 200.0f;
  c[2] = 200.0f;
  c[3] = 200.0f;
  c[4] = 200.0f;
  c[5] = 200.0f;

  // II
  double temp = dx * q_w / lambda / 2;
  for (int i=19;i<23;i++){
    A[i][i-6] = 0.5f;
    A[i][i-1] = 0.25f;
    A[i][i+1] = 0.25f;
    c[i] = temp;
  }

  // half II + half iso
  A[18][12] = 0.5f;
  A[18][19] = 0.5f;
  c[18] = q_w * dx / lambda / 2;

  // half II + half III
  A[23][22] = 1.0f / (2.0 + h * dx / lambda);
  A[23][17] = A[23][22];
  c[23] = (q_w * dx / lambda + h * dx * t_f / lambda) / (2.0 + h * dx / lambda);


  // Gaussian Seidel Method
  std::vector<double> x_aux(24,0);
  double error;

  do {
    error = 0;
    for (int i=0;i<24;i++){
      x_aux[i] = t[i];
      t[i] = 0;
      for (int j=0;j<24;j++){
        t[i] += A[i][j] * x_aux[j];
      }
      t[i] += c[i];
      double temp = std::abs(x_aux[i] - t[i]);
      if (temp > error)
        error = temp;
    }
  } while (error>0.0001);

//  for (int i=0;i<24;i++){
//    std::cout<<t[i]<<" ";
//    if (i%6 == 5) std::cout<<std::endl;
//  }

  // To file
  std::ofstream file;
  file.open("data.dat");
  file<<"# X Y Z\n";
  for (int i=0;i<24;i++){
    file << i%6 * 80 << " " << i/6 * 80 << " " << t[i] << "\n";
  }
  file.close();

  return 0;
}